

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFabricPortSetConfig(zes_fabric_port_handle_t hPort,zes_fabric_port_config_t *pConfig)

{
  zes_pfnFabricPortSetConfig_t pfnSetConfig;
  ze_result_t result;
  zes_fabric_port_config_t *pConfig_local;
  zes_fabric_port_handle_t hPort_local;
  
  pfnSetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cd28 != (code *)0x0) {
    pfnSetConfig._4_4_ = (*DAT_0011cd28)(hPort,pConfig);
  }
  return pfnSetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortSetConfig(
        zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
        const zes_fabric_port_config_t* pConfig         ///< [in] Contains new configuration of the Fabric Port.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetConfig = context.zesDdiTable.FabricPort.pfnSetConfig;
        if( nullptr != pfnSetConfig )
        {
            result = pfnSetConfig( hPort, pConfig );
        }
        else
        {
            // generic implementation
        }

        return result;
    }